

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O0

void ws_start_read(nni_ws *ws)

{
  int iVar1;
  ws_frame *pwVar2;
  undefined1 local_30 [8];
  nni_iov iov;
  nni_aio *aio;
  ws_frame *frame;
  nni_ws *ws_local;
  
  if (((ws->rxframe == (ws_frame *)0x0) && ((ws->closed & 1U) == 0)) &&
     ((iVar1 = nni_list_empty(&ws->recvq), iVar1 == 0 ||
      (iVar1 = nni_list_empty(&ws->rxq), iVar1 != 0)))) {
    pwVar2 = (ws_frame *)nni_zalloc(0xd8);
    if (pwVar2 == (ws_frame *)0x0) {
      iov.iov_len = (size_t)nni_list_first(&ws->recvq);
      if ((nni_aio *)iov.iov_len != (nni_aio *)0x0) {
        nni_aio_list_remove((nni_aio *)iov.iov_len);
        nni_aio_finish_error((nni_aio *)iov.iov_len,NNG_ENOMEM);
      }
      ws_close(ws,0x3f3);
    }
    else {
      pwVar2->hlen = 0;
      pwVar2->len = 0;
      ws->rxframe = pwVar2;
      iov.iov_len = (size_t)&ws->rxaio;
      iov.iov_buf = (void *)0x2;
      local_30 = (undefined1  [8])pwVar2->head;
      nni_aio_set_iov((nni_aio *)iov.iov_len,1,(nni_iov *)local_30);
      nni_http_read_full(ws->http,(nni_aio *)iov.iov_len);
    }
  }
  return;
}

Assistant:

static void
ws_start_read(nni_ws *ws)
{
	ws_frame *frame;
	nni_aio  *aio;
	nni_iov   iov;

	if ((ws->rxframe != NULL) || ws->closed) {
		return; // already reading or closed
	}

	// If nobody is waiting for recv, and we already have a data
	// frame, stop reading.  This keeps us from buffering infinitely.
	if (nni_list_empty(&ws->recvq) && !nni_list_empty(&ws->rxq)) {
		return;
	}

	if ((frame = NNI_ALLOC_STRUCT(frame)) == NULL) {
		if ((aio = nni_list_first(&ws->recvq)) != NULL) {
			nni_aio_list_remove(aio);
			nni_aio_finish_error(aio, NNG_ENOMEM);
		}
		ws_close(ws, WS_CLOSE_INTERNAL);
		return;
	}

	// Note that the frame is *not* associated with the message
	// as yet, because we don't know if that's right until we receive it.
	frame->hlen = 0;
	frame->len  = 0;
	ws->rxframe = frame;

	aio         = &ws->rxaio;
	iov.iov_len = 2; // We want the first two bytes.
	iov.iov_buf = frame->head;
	nni_aio_set_iov(aio, 1, &iov);
	nni_http_read_full(ws->http, aio);
}